

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O0

void __thiscall cmQtAutoGenerator::Logger::Logger(Logger *this)

{
  bool bVar1;
  char *str;
  ulong uVar2;
  undefined1 local_68 [8];
  string colorEnv;
  unsigned_long iVerbose;
  undefined1 local_30 [8];
  string verbose;
  Logger *this_local;
  
  verbose.field_2._8_8_ = this;
  std::mutex::mutex(&this->Mutex_);
  this->Verbosity_ = 0;
  this->ColorOutput_ = false;
  std::__cxx11::string::string((string *)local_30);
  bVar1 = cmsys::SystemTools::GetEnv("VERBOSE",(string *)local_30);
  if ((bVar1) && (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
    colorEnv.field_2._8_8_ = 0;
    str = (char *)std::__cxx11::string::c_str();
    bVar1 = cmSystemTools::StringToULong(str,(unsigned_long *)(colorEnv.field_2._M_local_buf + 8));
    if (bVar1) {
      SetVerbosity(this,colorEnv.field_2._8_4_);
    }
    else {
      bVar1 = cmSystemTools::IsOn((string *)local_30);
      SetVerbose(this,bVar1);
    }
  }
  std::__cxx11::string::~string((string *)local_30);
  std::__cxx11::string::string((string *)local_68);
  cmsys::SystemTools::GetEnv("COLOR",(string *)local_68);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    bVar1 = cmSystemTools::IsOn((string *)local_68);
    SetColorOutput(this,bVar1);
  }
  else {
    SetColorOutput(this,true);
  }
  std::__cxx11::string::~string((string *)local_68);
  return;
}

Assistant:

cmQtAutoGenerator::Logger::Logger()
{
  // Initialize logger
  {
    std::string verbose;
    if (cmSystemTools::GetEnv("VERBOSE", verbose) && !verbose.empty()) {
      unsigned long iVerbose = 0;
      if (cmSystemTools::StringToULong(verbose.c_str(), &iVerbose)) {
        SetVerbosity(static_cast<unsigned int>(iVerbose));
      } else {
        // Non numeric verbosity
        SetVerbose(cmSystemTools::IsOn(verbose));
      }
    }
  }
  {
    std::string colorEnv;
    cmSystemTools::GetEnv("COLOR", colorEnv);
    if (!colorEnv.empty()) {
      SetColorOutput(cmSystemTools::IsOn(colorEnv));
    } else {
      SetColorOutput(true);
    }
  }
}